

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  undefined *puVar2;
  long lVar3;
  int64_t iVar4;
  double *pdVar5;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  TPZVec<double> *in_RDI;
  double dVar6;
  int index;
  int j;
  int i;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  int numshape;
  int ord1;
  _func_int **in_stack_fffffffffffffa40;
  double *in_stack_fffffffffffffa48;
  TPZFNMatrix<20,_double> *in_stack_fffffffffffffa50;
  int local_520;
  int local_51c;
  undefined1 local_518 [312];
  undefined1 local_3e0 [328];
  undefined1 local_298 [312];
  undefined1 local_160 [312];
  int local_28;
  int local_24;
  TPZBaseMatrix *local_20;
  TPZBaseMatrix *local_18;
  TPZVec<double> *local_8;
  
  if (-1 < in_ESI + -2) {
    local_24 = in_ESI + -1;
    local_28 = (in_ESI + -1) * (in_ESI + -1);
    lVar3 = (long)local_28;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_8 = in_RDI;
    iVar4 = TPZBaseMatrix::Rows(in_RDX);
    if ((iVar4 < lVar3) || (iVar4 = TPZBaseMatrix::Cols(local_18), iVar4 < 1)) {
      (*(local_18->super_TPZSavable)._vptr_TPZSavable[0xd])(local_18,(long)local_28,1);
    }
    iVar4 = TPZBaseMatrix::Rows(local_20);
    if ((iVar4 < 2) || (iVar4 = TPZBaseMatrix::Cols(local_20), iVar4 < local_28)) {
      (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xd])(local_20,2,(long)local_28);
    }
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
               (int64_t)in_stack_fffffffffffffa40);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
               (int64_t)in_stack_fffffffffffffa40);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
               (int64_t)in_stack_fffffffffffffa40);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
               (int64_t)in_stack_fffffffffffffa40);
    puVar2 = TPZShapeLinear::fOrthogonal;
    pdVar5 = TPZVec<double>::operator[](local_8,0);
    (*(code *)puVar2)(*pdVar5,local_24,local_160,local_3e0);
    puVar2 = TPZShapeLinear::fOrthogonal;
    pdVar5 = TPZVec<double>::operator[](local_8,1);
    (*(code *)puVar2)(*pdVar5,local_24,local_298,local_518);
    for (local_51c = 0; local_51c < local_24; local_51c = local_51c + 1) {
      for (local_520 = 0; local_520 < local_24; local_520 = local_520 + 1) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        dVar6 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        dVar1 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        *pdVar5 = dVar6 * dVar1;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        dVar6 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        dVar1 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        *pdVar5 = dVar6 * dVar1;
        in_stack_fffffffffffffa50 =
             (TPZFNMatrix<20,_double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        in_stack_fffffffffffffa40 =
             (in_stack_fffffffffffffa50->super_TPZFMatrix<double>).super_TPZMatrix<double>.
             super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
        in_stack_fffffffffffffa48 =
             TPZFMatrix<double>::operator()
                       ((TPZFMatrix<double> *)in_stack_fffffffffffffa50,
                        (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        dVar6 = (double)in_stack_fffffffffffffa40 * *in_stack_fffffffffffffa48;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffffa50->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffffa48,(int64_t)in_stack_fffffffffffffa40);
        *pdVar5 = dVar6;
      }
    }
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1890d99);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1890da6);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1890db3);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1890dc0);
  }
  return;
}

Assistant:

void TPZShapeQuad::ShapeInternal(TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        
        if((order-2) < 0) return;
        int ord1 = order - 1;
        int numshape = (order-1)*(order-1);
        if(numshape > phi.Rows() || phi.Cols() < 1) phi.Resize(numshape,1);
        if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
        TPZFNMatrix<20, REAL> phi0(ord1,1),phi1(ord1,1),dphi0(1,ord1),dphi1(1,ord1);
        TPZShapeLinear::fOrthogonal(x[0],ord1,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(x[1],ord1,phi1,dphi1);
        for (int i=0;i<ord1;i++) {
            for (int j=0;j<ord1;j++) {
                int index = i*ord1+j;
                phi(index,0) =  phi0(i,0)* phi1(j,0);
                dphi(0,index) = dphi0(0,i)* phi1(j,0);
                dphi(1,index) =  phi0(i,0)*dphi1(0,j);
            }
        }
      
    }